

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerBailOnNotSpreadable(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  Func *func_00;
  RegOpnd *pRVar2;
  bool bVar3;
  ObjectType OVar4;
  uint32 uVar5;
  Opnd *opnd;
  RejitException *this_00;
  LabelInstr *isNotObjectLabel;
  IndirOpnd *pIVar6;
  IntConstOpnd *pIVar7;
  LabelInstr *target;
  LabelInstr *skipBailOutLabel;
  IndirOpnd *arrayLenPtrOpnd;
  LabelInstr *bailOutLabel;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  RegOpnd *pRStack_38;
  ValueType baseValueType;
  RegOpnd *arrayOpnd;
  Opnd *arraySrcOpnd;
  Func *func;
  Instr *prevInstr;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  func_00 = instr->m_func;
  opnd = IR::Instr::UnlinkSrc1(instr);
  pRStack_38 = GetRegOpnd(this,opnd,instr,func_00,TyUint64);
  local_3a.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_38->super_Opnd);
  bVar3 = ValueType::IsLikelyArray((ValueType *)&local_3a.field_0);
  if ((((bVar3) &&
       (bVar3 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_3a.field_0), !bVar3)) &&
      ((bVar3 = ValueType::IsLikelyObject((ValueType *)&local_3a.field_0), !bVar3 ||
       (OVar4 = ValueType::GetObjectType((ValueType *)&local_3a.field_0), OVar4 != ObjectWithArray))
      )) && (((bVar3 = ValueType::IsUninitialized((ValueType *)&local_3a.field_0), bVar3 ||
              (bVar3 = ValueType::HasBeenObject((ValueType *)&local_3a.field_0), bVar3)) &&
             (bVar3 = Func::IsInlinee(this->m_func), !bVar3)))) {
    isNotObjectLabel = IR::LabelInstr::New(Label,func_00,true);
    bVar3 = ValueType::IsArray((ValueType *)&local_3a.field_0);
    if (!bVar3) {
      GenerateArrayTest(this,pRStack_38,isNotObjectLabel,isNotObjectLabel,instr,false,false,false);
    }
    bVar3 = ValueType::IsArray((ValueType *)&local_3a.field_0);
    if ((!bVar3) || (bVar3 = ValueType::HasNoMissingValues((ValueType *)&local_3a.field_0), !bVar3))
    {
      pRVar2 = pRStack_38;
      uVar5 = Js::JavascriptArray::GetOffsetOfArrayFlags();
      pIVar6 = IR::IndirOpnd::New(pRVar2,uVar5,TyUint8,func_00,false);
      pIVar7 = IR::IntConstOpnd::New(4,TyUint8,func_00,true);
      InsertTestBranch(&pIVar6->super_Opnd,&pIVar7->super_Opnd,BrEq_A,isNotObjectLabel,instr);
    }
    pRVar2 = pRStack_38;
    uVar5 = Js::ArrayObject::GetOffsetOfLength();
    pIVar6 = IR::IndirOpnd::New(pRVar2,uVar5,TyUint32,func_00,false);
    pIVar7 = IR::IntConstOpnd::New(0xe,TyUint8,func_00,false);
    InsertCompareBranch(this,&pIVar6->super_Opnd,&pIVar7->super_Opnd,BrGt_A,true,isNotObjectLabel,
                        instr,false);
    target = IR::LabelInstr::New(Label,func_00,false);
    InsertBranch(Br,target,instr);
    IR::Instr::InsertBefore(instr,&isNotObjectLabel->super_Instr);
    IR::Instr::InsertAfter(instr,&target->super_Instr);
    GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    return pIVar1;
  }
  this_00 = (RejitException *)__cxa_allocate_exception(1);
  Js::RejitException::RejitException(this_00,InlineSpreadDisabled);
  __cxa_throw(this_00,&Js::RejitException::typeinfo,0);
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotSpreadable(IR::Instr *instr)
{
    // We only avoid bailing out / throwing a rejit exception when the array operand is a simple, non-optimized, non-object array.
    IR::Instr * prevInstr = instr->m_prev;
    Func *func = instr->m_func;

    IR::Opnd *arraySrcOpnd = instr->UnlinkSrc1();
    IR::RegOpnd *arrayOpnd = GetRegOpnd(arraySrcOpnd, instr, func, TyMachPtr);

    const ValueType baseValueType(arrayOpnd->GetValueType());

    // Check if we can just throw a rejit exception based on valuetype alone instead of bailing out.
    if (!baseValueType.IsLikelyArray()
        || baseValueType.IsLikelyAnyOptimizedArray()
        || (baseValueType.IsLikelyObject() && (baseValueType.GetObjectType() == ObjectType::ObjectWithArray))

        // Validate that GenerateArrayTest will not fail.
        || !(baseValueType.IsUninitialized() || baseValueType.HasBeenObject())

        || m_func->IsInlinee())
    {
        throw Js::RejitException(RejitReason::InlineSpreadDisabled);
    }

    // Past this point, we will need to use a bailout.
    IR::LabelInstr *bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true /* isOpHelper */);

    // See if we can skip various array checks on value type alone
    if (!baseValueType.IsArray())
    {
        GenerateArrayTest(arrayOpnd, bailOutLabel, bailOutLabel, instr, false);
    }
    if (!(baseValueType.IsArray() && baseValueType.HasNoMissingValues()))
    {
        InsertTestBranch(
            IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfArrayFlags(), TyUint8, func),
            IR::IntConstOpnd::New(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues), TyUint8, func, true),
            Js::OpCode::BrEq_A,
            bailOutLabel,
            instr);
    }

    IR::IndirOpnd *arrayLenPtrOpnd = IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfLength(), TyUint32, func);
    InsertCompareBranch(arrayLenPtrOpnd, IR::IntConstOpnd::New(Js::InlineeCallInfo::MaxInlineeArgoutCount - 1, TyUint8, func), Js::OpCode::BrGt_A, true, bailOutLabel, instr);

    IR::LabelInstr *skipBailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, skipBailOutLabel, instr);

    instr->InsertBefore(bailOutLabel);
    instr->InsertAfter(skipBailOutLabel);

    GenerateBailOut(instr);

    return prevInstr;
}